

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiJittered.cpp
# Opt level: O1

void __thiscall pm::MultiJittered::generateSamples(MultiJittered *this)

{
  Random *this_00;
  pointer pVVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint j;
  uint uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  Vector2 fillPoint;
  uint local_54;
  value_type local_38;
  
  fVar11 = (float)(this->super_Sampler).numSamples_;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  uVar5 = (this->super_Sampler).numSamples_;
  local_38.x = 0.0;
  local_38.y = 0.0;
  if ((this->super_Sampler).numSets_ * (this->super_Sampler).numSamples_ != 0) {
    uVar4 = 0;
    do {
      std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                (&(this->super_Sampler).samples_,&local_38);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->super_Sampler).numSets_ * (this->super_Sampler).numSamples_);
  }
  uVar4 = (uint)(long)fVar11;
  if ((this->super_Sampler).numSets_ != 0) {
    fVar11 = 1.0 / (float)uVar5;
    this_00 = &(this->super_Sampler).rnd_;
    uVar5 = 0;
    do {
      if (uVar4 != 0) {
        uVar10 = 0;
        uVar8 = 0;
        do {
          iVar6 = 0;
          uVar9 = uVar10;
          uVar7 = uVar8;
          do {
            fVar12 = Random::real(this_00);
            (this->super_Sampler).samples_.
            super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
            super__Vector_impl_data._M_start[(this->super_Sampler).numSamples_ * uVar5 + uVar9].x =
                 (float)uVar9 * fVar11 + fVar12 * fVar11;
            fVar12 = Random::real(this_00);
            (this->super_Sampler).samples_.
            super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
            super__Vector_impl_data._M_start[(this->super_Sampler).numSamples_ * uVar5 + uVar9].y =
                 (float)uVar7 * fVar11 + fVar12 * fVar11;
            iVar6 = iVar6 + -1;
            uVar7 = uVar7 + uVar4;
            uVar9 = uVar9 + 1;
          } while (uVar4 + iVar6 != 0);
          uVar8 = uVar8 + 1;
          uVar10 = uVar10 + uVar4;
        } while (uVar8 != uVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Sampler).numSets_);
  }
  if ((this->super_Sampler).numSets_ != 0) {
    uVar5 = 0;
    do {
      if (uVar4 != 0) {
        iVar6 = 0;
        uVar8 = 0;
        do {
          uVar9 = 0;
          uVar10 = uVar4;
          do {
            uVar10 = uVar10 - 1;
            fVar12 = Random::real(&(this->super_Sampler).rnd_);
            iVar2 = (this->super_Sampler).numSamples_ * uVar5;
            uVar3 = iVar6 + uVar9 + iVar2;
            pVVar1 = (this->super_Sampler).samples_.
                     super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
                     super__Vector_impl_data._M_start;
            fVar11 = pVVar1[uVar3].x;
            uVar7 = iVar2 + uVar8 * uVar4 + (int)(long)((float)uVar10 * fVar12 + (float)uVar9);
            pVVar1[uVar3].x = pVVar1[uVar7].x;
            pVVar1[uVar7].x = fVar11;
            uVar9 = uVar9 + 1;
          } while (uVar10 != 0);
          uVar8 = uVar8 + 1;
          iVar6 = iVar6 + uVar4;
        } while (uVar8 != uVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Sampler).numSets_);
  }
  if ((this->super_Sampler).numSets_ != 0) {
    uVar5 = 0;
    do {
      if (uVar4 != 0) {
        local_54 = 0;
        do {
          uVar9 = 0;
          uVar10 = local_54;
          uVar8 = uVar4;
          do {
            uVar8 = uVar8 - 1;
            fVar12 = Random::real(&(this->super_Sampler).rnd_);
            iVar6 = (this->super_Sampler).numSamples_ * uVar5;
            uVar7 = uVar10 + iVar6;
            pVVar1 = (this->super_Sampler).samples_.
                     super__Vector_base<pm::Vector2,_std::allocator<pm::Vector2>_>._M_impl.
                     super__Vector_impl_data._M_start;
            fVar11 = pVVar1[uVar7].y;
            uVar3 = iVar6 + local_54 + (int)(long)((float)uVar8 * fVar12 + (float)uVar9) * uVar4;
            pVVar1[uVar7].y = pVVar1[uVar3].y;
            pVVar1[uVar3].y = fVar11;
            uVar9 = uVar9 + 1;
            uVar10 = uVar10 + uVar4;
          } while (uVar8 != 0);
          local_54 = local_54 + 1;
        } while (local_54 != uVar4);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->super_Sampler).numSets_);
  }
  return;
}

Assistant:

void MultiJittered::generateSamples(void)
{
	// num_samples needs to be a perfect square
	const unsigned int n = static_cast<unsigned int>(sqrtf(static_cast<float>(numSamples_)));
	const float subcellWidth = 1.0f / static_cast<float>(numSamples_);

	// fill the samples array with dummy points to allow us to use the [ ] notation
	// when we set the initial patterns

	Vector2 fillPoint;
	for (unsigned int i = 0; i < numSamples_ * numSets_; i++)
		samples_.push_back(fillPoint);

	// distribute points in the initial patterns
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				samples_[i * n + j + p * numSamples_].x = (i * n + j) * subcellWidth + rnd_.real() * subcellWidth;
				samples_[i * n + j + p * numSamples_].y = (j * n + i) * subcellWidth + rnd_.real() * subcellWidth;
			}

	// shuffle x coordinates
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				// random integer between j and n - 1
				const unsigned int k = static_cast<unsigned int>(rnd_.real() * (n - 1 - j) + j);
				const float t = samples_[i * n + j + p * numSamples_].x;
				samples_[i * n + j + p * numSamples_].x = samples_[i * n + k + p * numSamples_].x;
				samples_[i * n + k + p * numSamples_].x = t;
			}

	// shuffle y coordinates
	for (unsigned int p = 0; p < numSets_; p++)
		for (unsigned int i = 0; i < n; i++)
			for (unsigned int j = 0; j < n; j++)
			{
				// random integer between j and n - 1
				const int unsigned k = static_cast<unsigned int>(rnd_.real() * (n - 1 - j) + j);
				const float t = samples_[j * n + i + p * numSamples_].y;
				samples_[j * n + i + p * numSamples_].y = samples_[k * n + i + p * numSamples_].y;
				samples_[k * n + i + p * numSamples_].y = t;
			}
}